

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

void __thiscall
cfg::tag_int_scalar_t<cfgfile::qstring_trait_t>::tag_int_scalar_t
          (tag_int_scalar_t<cfgfile::qstring_trait_t> *this,tag_t<cfgfile::qstring_trait_t> *owner,
          string_t *name,bool is_mandatory)

{
  _Rb_tree_header *p_Var1;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  set<QString,_std::less<QString>,_std::allocator<QString>_> *this_01;
  storage_type *psVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QString local_78;
  QArrayData *local_58;
  char16_t *pcStack_50;
  QArrayData local_48;
  string_t local_38;
  
  cfgfile::tag_t<cfgfile::qstring_trait_t>::tag_t
            ((tag_t<cfgfile::qstring_trait_t> *)this,owner,name,is_mandatory);
  (this->super_tag_scalar_t<int,_cfgfile::qstring_trait_t>).m_value = 0;
  (this->super_tag_scalar_t<int,_cfgfile::qstring_trait_t>).m_constraint = (constraint_t<int> *)0x0;
  (this->super_tag_scalar_t<int,_cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_int_scalar_t_00146ac8;
  (this->m_int_scalar_constraint).super_constraint_t<int>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_one_of_t_00146b30;
  p_Var1 = &(this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"string_field","");
  if (local_58 == (QArrayData *)0x0) {
    psVar2 = (storage_type *)0x0;
  }
  else {
    psVar2 = (storage_type *)strlen((char *)local_58);
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar3);
  local_38.m_str.d.d = local_78.d.d;
  local_38.m_str.d.ptr = local_78.d.ptr;
  local_38.m_str.d.size = local_78.d.size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  cfgfile::tag_t<cfgfile::qstring_trait_t>::tag_t
            (&(this->m_string_field).super_tag_t<cfgfile::qstring_trait_t>,
             (tag_t<cfgfile::qstring_trait_t> *)this,&local_38,true);
  (this->m_string_field).super_tag_t<cfgfile::qstring_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_00146808;
  (this->m_string_field).m_value.d.d = (Data *)0x0;
  (this->m_string_field).m_value.d.ptr = (char16_t *)0x0;
  (this->m_string_field).m_value.d.size = 0;
  (this->m_string_field).m_constraint = (constraint_t<QString> *)0x0;
  if (&(local_38.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48._0_8_ + 1);
  }
  (this->m_string_field_constraint).super_constraint_t<QString>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_one_of_t_00146870;
  p_Var1 = &(this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._0_4_ = 100;
  this_00 = &(this->m_int_scalar_constraint).m_list;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_58);
  local_58._0_4_ = 200;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_58);
  local_58 = (QArrayData *)CONCAT44(local_58._4_4_,300);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_58);
  (this->super_tag_scalar_t<int,_cfgfile::qstring_trait_t>).m_constraint =
       &(this->m_int_scalar_constraint).super_constraint_t<int>;
  QVar4.m_data = (storage_type *)0x3;
  QVar4.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar4);
  local_78.d.d = (Data *)local_58;
  local_78.d.ptr = pcStack_50;
  local_78.d.size._0_4_ = local_48.ref_._q_value.super___atomic_base<int>._M_i;
  local_78.d.size._4_4_ = local_48.flags.i;
  this_01 = &(this->m_string_field_constraint).m_list;
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_01,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  QVar5.m_data = (storage_type *)0x3;
  QVar5.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar5);
  local_78.d.d = (Data *)local_58;
  local_78.d.ptr = pcStack_50;
  local_78.d.size._0_4_ = local_48.ref_._q_value.super___atomic_base<int>._M_i;
  local_78.d.size._4_4_ = local_48.flags.i;
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_01,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  QVar6.m_data = (storage_type *)0x5;
  QVar6.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar6);
  local_78.d.d = (Data *)local_58;
  local_78.d.ptr = pcStack_50;
  local_78.d.size._0_4_ = local_48.ref_._q_value.super___atomic_base<int>._M_i;
  local_78.d.size._4_4_ = local_48.flags.i;
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_01,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  QVar7.m_data = (storage_type *)0x8;
  QVar7.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar7);
  local_78.d.d = (Data *)local_58;
  local_78.d.ptr = pcStack_50;
  local_78.d.size._0_4_ = local_48.ref_._q_value.super___atomic_base<int>._M_i;
  local_78.d.size._4_4_ = local_48.flags.i;
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_01,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  (this->m_string_field).m_constraint =
       &(this->m_string_field_constraint).super_constraint_t<QString>;
  return;
}

Assistant:

tag_int_scalar_t( cfgfile::tag_t< Trait > & owner, const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_scalar_t< int, Trait >( owner, name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
	{
		m_int_scalar_constraint.add_value( 100 );
		m_int_scalar_constraint.add_value( 200 );
		m_int_scalar_constraint.add_value( 300 );
		this->set_constraint( &m_int_scalar_constraint );

		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field_constraint.add_value( "one\n\"\r\t\\" );
		m_string_field.set_constraint( &m_string_field_constraint );

	}